

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O1

const_iterator * __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::begin(const_iterator *__return_storage_ptr__,
       SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
       *this)

{
  __node_type *p_Var1;
  ulong uVar2;
  byte bVar3;
  size_t sVar4;
  
  p_Var1 = (__node_type *)
           (this->_bits).
           super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           .
           super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ._M_h._M_before_begin._M_nxt;
  (__return_storage_ptr__->container_it).
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur = p_Var1;
  (__return_storage_ptr__->container_end).
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (__node_type *)0x0;
  __return_storage_ptr__->pos = 0;
  if ((this->_bits).
      super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
      .
      super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ._M_h._M_element_count != 0) {
    uVar2 = *(ulong *)((long)&(p_Var1->
                              super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                              ._M_storage._M_storage + 8);
    if ((uVar2 & 1) == 0) {
      sVar4 = 0;
      do {
        if (sVar4 == 0x3f) {
          sVar4 = 0x40;
          break;
        }
        bVar3 = (byte)sVar4;
        sVar4 = sVar4 + 1;
      } while ((uVar2 >> (bVar3 & 0x3f) & 2) == 0);
    }
    else {
      sVar4 = __return_storage_ptr__->pos;
    }
    __return_storage_ptr__->pos = sVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin() const { return const_iterator(_bits); }